

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateCacheVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateCacheVkImpl::GetData(PipelineStateCacheVkImpl *this,IDataBlob **ppBlob)

{
  VkDevice pVVar1;
  VkPipelineCache pVVar2;
  PFN_vkGetPipelineCacheData p_Var3;
  RefCntAutoPtr<Diligent::DataBlobImpl> RVar4;
  VkResult VVar5;
  void *pvVar6;
  RefCntAutoPtr<Diligent::DataBlobImpl> pDataBlob;
  size_t DataSize;
  
  if (ppBlob == (IDataBlob **)0x0) {
    FormatString<char[24]>((string *)&DataSize,(char (*) [24])"ppBlob must not be null");
    DebugAssertionFailed
              ((Char *)DataSize,"GetData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateCacheVkImpl.cpp"
               ,0x55);
    std::__cxx11::string::~string((string *)&DataSize);
  }
  *ppBlob = (IDataBlob *)0x0;
  pVVar1 = ((((this->super_PipelineStateCacheBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineStateCacheVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateCacheDesc>
             .m_pDevice)->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->m_VkDevice;
  DataSize = 0;
  VVar5 = (*vkGetPipelineCacheData)
                    (pVVar1,(this->m_PipelineStateCache).m_VkObject,&DataSize,(void *)0x0);
  if (VVar5 == VK_SUCCESS) {
    DataBlobImpl::Create((DataBlobImpl *)&pDataBlob,DataSize,(void *)0x0);
    p_Var3 = vkGetPipelineCacheData;
    pVVar2 = (this->m_PipelineStateCache).m_VkObject;
    pvVar6 = DataBlobImpl::GetDataPtr(pDataBlob.m_pObject,0);
    VVar5 = (*p_Var3)(pVVar1,pVVar2,&DataSize,pvVar6);
    RVar4 = pDataBlob;
    if (VVar5 == VK_SUCCESS) {
      pDataBlob.m_pObject = (DataBlobImpl *)0x0;
      *ppBlob = (IDataBlob *)RVar4.m_pObject;
    }
    RefCntAutoPtr<Diligent::DataBlobImpl>::Release(&pDataBlob);
  }
  return;
}

Assistant:

void PipelineStateCacheVkImpl::GetData(IDataBlob** ppBlob)
{
    DEV_CHECK_ERR(ppBlob != nullptr, "ppBlob must not be null");
    *ppBlob = nullptr;

    const auto vkDevice = m_pDevice->GetLogicalDevice().GetVkDevice();

    size_t DataSize = 0;
    if (vkGetPipelineCacheData(vkDevice, m_PipelineStateCache, &DataSize, nullptr) != VK_SUCCESS)
        return;

    auto pDataBlob = DataBlobImpl::Create(DataSize);

    if (vkGetPipelineCacheData(vkDevice, m_PipelineStateCache, &DataSize, pDataBlob->GetDataPtr()) != VK_SUCCESS)
        return;

    *ppBlob = pDataBlob.Detach();
}